

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Btree * findBtree(sqlite3 *pErrorDb,sqlite3 *pDb,char *zDb)

{
  uint uVar1;
  int iVar2;
  Btree *pBVar3;
  long in_FS_OFFSET;
  undefined1 local_1d0 [240];
  undefined1 *puStack_e0;
  undefined1 *local_d8;
  undefined1 *puStack_d0;
  Parse *local_c8;
  char *pcStack_c0;
  undefined1 *local_b8;
  undefined1 local_b0 [136];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = sqlite3FindDbName(pDb,zDb);
  if (uVar1 == 1) {
    local_b8 = &DAT_aaaaaaaaaaaaaaaa;
    local_c8 = (Parse *)&DAT_aaaaaaaaaaaaaaaa;
    pcStack_c0 = &DAT_aaaaaaaaaaaaaaaa;
    local_d8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_d0 = &DAT_aaaaaaaaaaaaaaaa;
    local_1d0._232_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_e0 = &DAT_aaaaaaaaaaaaaaaa;
    memset(local_1d0 + 8,0,0xe0);
    memset(local_b0,0,0x88);
    local_c8 = pDb->pParse;
    pDb->pParse = (Parse *)local_1d0;
    local_1d0._0_8_ = pDb;
    if (pDb->mallocFailed != '\0') {
      sqlite3ErrorMsg((Parse *)local_1d0,"out of memory");
    }
    iVar2 = sqlite3OpenTempDatabase((Parse *)local_1d0);
    if (iVar2 != 0) {
      sqlite3ErrorWithMsg(pErrorDb,local_1d0._24_4_,"%s",local_1d0._8_8_);
      if ((char *)local_1d0._8_8_ != (char *)0x0) {
        sqlite3DbFreeNN(pErrorDb,(void *)local_1d0._8_8_);
      }
      sqlite3ParseObjectReset((Parse *)local_1d0);
      pBVar3 = (Btree *)0x0;
      goto LAB_00123187;
    }
    if ((char *)local_1d0._8_8_ != (char *)0x0) {
      sqlite3DbFreeNN(pErrorDb,(void *)local_1d0._8_8_);
    }
    sqlite3ParseObjectReset((Parse *)local_1d0);
  }
  else if ((int)uVar1 < 0) {
    pBVar3 = (Btree *)0x0;
    sqlite3ErrorWithMsg(pErrorDb,1,"unknown database %s",zDb);
    goto LAB_00123187;
  }
  pBVar3 = pDb->aDb[uVar1].pBt;
LAB_00123187:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return pBVar3;
  }
  __stack_chk_fail();
}

Assistant:

static Btree *findBtree(sqlite3 *pErrorDb, sqlite3 *pDb, const char *zDb){
  int i = sqlite3FindDbName(pDb, zDb);

  if( i==1 ){
    Parse sParse;
    int rc = 0;
    sqlite3ParseObjectInit(&sParse,pDb);
    if( sqlite3OpenTempDatabase(&sParse) ){
      sqlite3ErrorWithMsg(pErrorDb, sParse.rc, "%s", sParse.zErrMsg);
      rc = SQLITE_ERROR;
    }
    sqlite3DbFree(pErrorDb, sParse.zErrMsg);
    sqlite3ParseObjectReset(&sParse);
    if( rc ){
      return 0;
    }
  }

  if( i<0 ){
    sqlite3ErrorWithMsg(pErrorDb, SQLITE_ERROR, "unknown database %s", zDb);
    return 0;
  }

  return pDb->aDb[i].pBt;
}